

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

unsigned_long
mxx::scatter_one<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs,int root,comm *comm)

{
  pointer msgs_00;
  unsigned_long result;
  
  msgs_00 = (msgs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((comm->m_rank == root) &&
     ((long)(msgs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)msgs_00 >> 3 != (long)comm->m_size)) {
    assert_fail("comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,0xfe,"scatter_one");
    msgs_00 = (msgs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  scatter<unsigned_long>(msgs_00,1,&result,root,comm);
  return result;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}